

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

void slang::ast::packBitstream(ConstantValue *value,SmallVectorBase<slang::ConstantValue_*> *packed)

{
  bool bVar1;
  ulong uVar2;
  iterator pCVar3;
  Map *this;
  AssociativeArray *this_00;
  reference ppVar4;
  Queue *this_01;
  SVQueue *this_02;
  reference value_00;
  Union *this_03;
  SVUnion *value_01;
  ConstantValue *cv_1;
  iterator __end7;
  iterator __begin7;
  SVQueue *__range7;
  pair<const_slang::ConstantValue,_slang::ConstantValue> *kv;
  iterator __end6;
  iterator __begin6;
  AssociativeArray *__range6;
  ConstantValue *cv;
  iterator __end5;
  iterator __begin5;
  span<slang::ConstantValue,_18446744073709551615UL> *local_30;
  span<slang::ConstantValue,_18446744073709551615UL> *__range5;
  SmallVectorBase<slang::ConstantValue_*> *local_20;
  SmallVectorBase<slang::ConstantValue_*> *local_18;
  SmallVectorBase<slang::ConstantValue_*> *packed_local;
  ConstantValue *value_local;
  
  local_18 = packed;
  packed_local = (SmallVectorBase<slang::ConstantValue_*> *)value;
  bVar1 = slang::ConstantValue::isInteger(value);
  if (bVar1) {
    local_20 = packed_local;
    SmallVectorBase<slang::ConstantValue_*>::push_back(local_18,(ConstantValue **)&local_20);
  }
  else {
    bVar1 = slang::ConstantValue::isString((ConstantValue *)packed_local);
    if (bVar1) {
      slang::ConstantValue::str_abi_cxx11_((ConstantValue *)packed_local);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        __range5 = (span<slang::ConstantValue,_18446744073709551615UL> *)packed_local;
        SmallVectorBase<slang::ConstantValue_*>::push_back(local_18,(ConstantValue **)&__range5);
      }
    }
    else {
      bVar1 = slang::ConstantValue::isUnpacked((ConstantValue *)packed_local);
      if (bVar1) {
        ___begin5 = slang::ConstantValue::elements((ConstantValue *)packed_local);
        local_30 = (span<slang::ConstantValue,_18446744073709551615UL> *)&__begin5;
        __end5 = nonstd::span_lite::span<slang::ConstantValue,_18446744073709551615UL>::begin
                           (local_30);
        pCVar3 = nonstd::span_lite::span<slang::ConstantValue,_18446744073709551615UL>::end
                           (local_30);
        for (; __end5 != pCVar3; __end5 = __end5 + 1) {
          packBitstream(__end5,local_18);
        }
      }
      else {
        bVar1 = slang::ConstantValue::isMap((ConstantValue *)packed_local);
        if (bVar1) {
          this = slang::ConstantValue::map((ConstantValue *)packed_local);
          this_00 = CopyPtr<slang::AssociativeArray>::operator*(this);
          __end6 = std::
                   map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                   ::begin(&this_00->
                            super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                          );
          kv = (pair<const_slang::ConstantValue,_slang::ConstantValue> *)
               std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::end(&this_00->
                      super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                    );
          while (bVar1 = std::operator!=(&__end6,(_Self *)&kv), bVar1) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                     ::operator*(&__end6);
            packBitstream(&ppVar4->second,local_18);
            std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
            operator++(&__end6);
          }
        }
        else {
          bVar1 = slang::ConstantValue::isQueue((ConstantValue *)packed_local);
          if (bVar1) {
            this_01 = slang::ConstantValue::queue((ConstantValue *)packed_local);
            this_02 = CopyPtr<slang::SVQueue>::operator*(this_01);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin
                      ((iterator *)&__end7._M_node,
                       &this_02->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                      ((iterator *)&cv_1,
                       &this_02->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
            while (bVar1 = std::operator!=((_Self *)&__end7._M_node,(_Self *)&cv_1), bVar1) {
              value_00 = std::
                         _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                         ::operator*((_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                                      *)&__end7._M_node);
              packBitstream(value_00,local_18);
              std::
              _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
              ::operator++((_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                            *)&__end7._M_node);
            }
          }
          else {
            bVar1 = slang::ConstantValue::isUnion((ConstantValue *)packed_local);
            if (bVar1) {
              this_03 = slang::ConstantValue::unionVal((ConstantValue *)packed_local);
              value_01 = CopyPtr<slang::SVUnion>::operator->(this_03);
              packBitstream(&value_01->value,local_18);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void packBitstream(ConstantValue& value, SmallVectorBase<ConstantValue*>& packed) {
    if (value.isInteger()) {
        packed.push_back(&value);
    }
    else if (value.isString()) {
        if (!value.str().empty())
            packed.push_back(&value);
    }
    else if (value.isUnpacked()) {
        for (auto& cv : value.elements())
            packBitstream(cv, packed);
    }
    else if (value.isMap()) {
        for (auto& kv : *value.map()) {
            packBitstream(kv.second, packed);
        }
    }
    else if (value.isQueue()) {
        for (auto& cv : *value.queue())
            packBitstream(cv, packed);
    }
    else if (value.isUnion()) {
        packBitstream(value.unionVal()->value, packed);
    }
}